

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O0

CMutableTransaction * __thiscall
TestChain100Setup::CreateValidMempoolTransaction
          (TestChain100Setup *this,
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *input_transactions,vector<COutPoint,_std::allocator<COutPoint>_> *inputs,int input_height
          ,vector<CKey,_std::allocator<CKey>_> *input_signing_keys,
          vector<CTxOut,_std::allocator<CTxOut>_> *outputs,bool submit)

{
  long lVar1;
  byte bVar2;
  AnnotatedMixin<std::recursive_mutex> *pszFile;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_RDX;
  AnnotatedMixin<std::recursive_mutex> *in_RSI;
  CMutableTransaction *in_RDI;
  long in_FS_OFFSET;
  MempoolAcceptResult *in_stack_00000008;
  byte in_stack_00000010;
  CMutableTransaction *mempool_txn;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock28;
  MempoolAcceptResult result;
  vector<CTxOut,_std::allocator<CTxOut>_> *in_stack_000003e0;
  optional<CFeeRate> *in_stack_000003e8;
  optional<unsigned_int> *in_stack_000003f0;
  CMutableTransaction *txIn;
  CMutableTransaction *this_00;
  undefined8 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe5f;
  CTransactionRef *in_stack_fffffffffffffe60;
  undefined6 in_stack_fffffffffffffe68;
  undefined1 uVar3;
  optional<unsigned_int> local_100;
  optional<CFeeRate> local_f8;
  int local_e8;
  pointer in_stack_ffffffffffffff28;
  uint32_t in_stack_ffffffffffffff34;
  vector<COutPoint,_std::allocator<COutPoint>_> *in_stack_ffffffffffffff38;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *in_stack_ffffffffffffff40;
  TestChain100Setup *in_stack_ffffffffffffff48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_stack_00000010 & 1;
  uVar3 = 0;
  std::optional<CFeeRate>::optional(&local_f8);
  std::optional<unsigned_int>::optional(&local_100);
  txIn = (CMutableTransaction *)&local_f8;
  this_00 = (CMutableTransaction *)&local_100;
  CreateValidTransaction
            (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
             in_stack_ffffffffffffff34,
             (vector<CKey,_std::allocator<CKey>_> *)in_stack_ffffffffffffff28,in_stack_000003e0,
             in_stack_000003e8,in_stack_000003f0);
  CMutableTransaction::CMutableTransaction(this_00,txIn);
  std::pair<CMutableTransaction,_long>::~pair((pair<CMutableTransaction,_long> *)in_stack_00000008);
  if ((bVar2 & 1) != 0) {
    pszFile = MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                        ((AnnotatedMixin<std::recursive_mutex> *)in_stack_00000008);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (in_RDX,in_RSI,(char *)in_RDI,(char *)pszFile,
               (int)((ulong)in_stack_fffffffffffffe08 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffe08 >> 0x18,0));
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_00000008);
    MakeTransactionRef<CMutableTransaction&>(txIn);
    ChainstateManager::ProcessTransaction
              ((ChainstateManager *)CONCAT17(bVar2,CONCAT16(uVar3,in_stack_fffffffffffffe68)),
               in_stack_fffffffffffffe60,(bool)in_stack_fffffffffffffe5f);
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_00000008);
    if (local_e8 != 0) {
      __assert_fail("result.m_result_type == MempoolAcceptResult::ResultType::VALID",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/setup_common.cpp"
                    ,0x1e0,
                    "CMutableTransaction TestChain100Setup::CreateValidMempoolTransaction(const std::vector<CTransactionRef> &, const std::vector<COutPoint> &, int, const std::vector<CKey> &, const std::vector<CTxOut> &, bool)"
                   );
    }
    MempoolAcceptResult::~MempoolAcceptResult(in_stack_00000008);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_00000008);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

CMutableTransaction TestChain100Setup::CreateValidMempoolTransaction(const std::vector<CTransactionRef>& input_transactions,
                                                                     const std::vector<COutPoint>& inputs,
                                                                     int input_height,
                                                                     const std::vector<CKey>& input_signing_keys,
                                                                     const std::vector<CTxOut>& outputs,
                                                                     bool submit)
{
    CMutableTransaction mempool_txn = CreateValidTransaction(input_transactions, inputs, input_height, input_signing_keys, outputs, std::nullopt, std::nullopt).first;
    // If submit=true, add transaction to the mempool.
    if (submit) {
        LOCK(cs_main);
        const MempoolAcceptResult result = m_node.chainman->ProcessTransaction(MakeTransactionRef(mempool_txn));
        assert(result.m_result_type == MempoolAcceptResult::ResultType::VALID);
    }
    return mempool_txn;
}